

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O1

int CfdInitializeBlockHandle(void *handle,int network_type,char *block_hex,void **block_handle)

{
  pointer pcVar1;
  bool bVar2;
  NetType NVar3;
  void *pvVar4;
  Block *this;
  CfdException *pCVar5;
  bool is_bitcoin;
  bool local_5a;
  allocator local_59;
  undefined1 local_58 [32];
  void *local_38;
  
  local_38 = handle;
  cfd::Initialize();
  if (block_handle == (void **)0x0) {
    local_58._0_8_ = "cfdcapi_block.cpp";
    local_58._8_4_ = 0x54;
    local_58._16_8_ = "CfdInitializeBlockHandle";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"block_handle is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Failed to parameter. block_handle is null.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(block_hex);
  if (!bVar2) {
    pcVar1 = local_58 + 0x10;
    local_58._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"BlockOpe","");
    pvVar4 = cfd::capi::AllocBuffer((string *)local_58,0x20);
    if ((pointer)local_58._0_8_ != pcVar1) {
      operator_delete((void *)local_58._0_8_);
    }
    local_5a = false;
    NVar3 = cfd::capi::ConvertNetType(network_type,&local_5a);
    *(NetType *)((long)pvVar4 + 0x10) = NVar3;
    if (local_5a == true) {
      this = (Block *)operator_new(0xa8);
      std::__cxx11::string::string((string *)local_58,block_hex,&local_59);
      cfd::core::Block::Block(this,(string *)local_58);
      *(Block **)((long)pvVar4 + 0x18) = this;
      if ((pointer)local_58._0_8_ != pcVar1) {
        operator_delete((void *)local_58._0_8_);
      }
      *block_handle = pvVar4;
      return 0;
    }
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Elements is not supported.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_58._0_8_ = "cfdcapi_block.cpp";
  local_58._8_4_ = 0x5a;
  local_58._16_8_ = "CfdInitializeBlockHandle";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"block_hex is null or empty.");
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,"Failed to parameter. block_hex is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeBlockHandle(
    void* handle, int network_type, const char* block_hex,
    void** block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiBlockData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (block_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "block_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_handle is null.");
    }
    if (IsEmptyString(block_hex)) {
      warn(CFD_LOG_SOURCE, "block_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_hex is null or empty.");
    }

    buffer = static_cast<CfdCapiBlockData*>(
        AllocBuffer(kPrefixBlock, sizeof(CfdCapiBlockData)));

    bool is_bitcoin = false;
    buffer->net_type = ConvertNetType(network_type, &is_bitcoin);
    if (is_bitcoin) {
      buffer->block = new Block(std::string(block_hex));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    *block_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeBlockHandle(handle, buffer);
  return result;
}